

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O1

void __thiscall
kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_>::insert
          (miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *this,
          spectral_operation *trans)

{
  uint uVar1;
  pointer psVar2;
  uint16_t uVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = (long)(this->transforms).
                super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->transforms).
                super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
                ._M_impl.super__Vector_impl_data._M_start >> 1;
  uVar5 = lVar4 * -0x5555555555555555;
  if (uVar5 < this->transform_index || uVar5 - this->transform_index == 0) {
    std::
    vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>::
    resize(&this->transforms,lVar4 * 0x5555555555555556);
  }
  uVar1 = this->transform_index;
  this->transform_index = uVar1 + 1;
  psVar2 = (this->transforms).
           super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2[uVar1]._var2 = trans->_var2;
  uVar3 = trans->_var1;
  psVar2 = psVar2 + uVar1;
  psVar2->_kind = trans->_kind;
  psVar2->_var1 = uVar3;
  return;
}

Assistant:

void insert( const spectral_operation& trans )
  {
    if ( transform_index >= transforms.size() )
    {
      transforms.resize( transforms.size() << 1 );
    }
    assert( transform_index < transforms.size() );
    transforms[transform_index++] = trans;
  }